

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void google::protobuf::internal::DynamicMapField::ClearMapNoSyncImpl(MapFieldBase *base)

{
  NodeBase *pNVar1;
  Arena *pAVar2;
  ClearInput input;
  iterator __begin3;
  UntypedMapIterator local_28;
  
  pAVar2 = MapFieldBase::arena(base);
  if (pAVar2 == (Arena *)0x0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
              ((iterator *)&local_28,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(base + 1));
    pNVar1 = local_28.node_;
    while (local_28.node_ = pNVar1, local_28.node_ != (NodeBase *)0x0) {
      MapValueRef::DeleteData((MapValueRef *)(local_28.node_ + 6));
      pNVar1 = (local_28.node_)->next;
      if ((local_28.node_)->next == (NodeBase *)0x0) {
        UntypedMapIterator::SearchFrom(&local_28,local_28.bucket_index_ + 1);
        pNVar1 = local_28.node_;
      }
    }
  }
  if (*(int *)((long)&base[1].super_MapFieldBaseForParse.vtable_ + 4) != 1) {
    input.destroy_node =
         UntypedMapBase::
         DestroyNode<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::Node>
    ;
    input.size_info = 0x400030;
    input.destroy_bits = '\b';
    input.reset_table = true;
    input._6_2_ = 0;
    UntypedMapBase::ClearTable((UntypedMapBase *)(base + 1),input);
  }
  return;
}

Assistant:

void DynamicMapField::ClearMapNoSyncImpl(MapFieldBase& base) {
  auto& self = static_cast<DynamicMapField&>(base);
  if (self.arena() == nullptr) {
    for (auto& elem : self.map_) {
      elem.second.DeleteData();
    }
  }

  self.map_.clear();
}